

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitSelect(I64ToI32Lowering *this,Select *curr)

{
  Builder *this_00;
  Builder *pBVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  bool bVar4;
  bool bVar5;
  Index IVar6;
  Index IVar7;
  LocalSet *any;
  LocalGet *pLVar8;
  Select *pSVar9;
  LocalSet *append;
  LocalGet *ifTrue;
  LocalGet *ifFalse;
  LocalSet *args;
  Block *e;
  TempVar local_100;
  TempVar local_e0;
  undefined1 local_c0 [8];
  TempVar highBits;
  TempVar lowBits;
  TempVar cond;
  
  bVar4 = handleUnreachable(this,(Expression *)curr);
  if (!bVar4) {
    bVar4 = hasOutParam(this,curr->ifTrue);
    bVar5 = hasOutParam(this,curr->ifFalse);
    if (bVar4) {
      if (!bVar5) {
        __assert_fail("hasOutParam(curr->ifFalse)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x61c,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
      }
      getTemp((TempVar *)local_c0,this,(Type)0x2);
      getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
      getTemp((TempVar *)&lowBits.ty,this,(Type)0x2);
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
      any = Builder::makeLocalSet(this_00,IVar6,curr->condition);
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar7 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
      pLVar8 = Builder::makeLocalGet(pBVar2,IVar7,(Type)0x2);
      pSVar9 = Builder::makeSelect(pBVar2,(Expression *)pLVar8,curr->ifTrue,curr->ifFalse);
      append = Builder::makeLocalSet(pBVar1,IVar6,(Expression *)pSVar9);
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c0);
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar7 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
      pLVar8 = Builder::makeLocalGet(pBVar2,IVar7,(Type)0x2);
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      fetchOutParam(&local_100,this,curr->ifTrue);
      IVar7 = TempVar::operator_cast_to_unsigned_int(&local_100);
      ifTrue = Builder::makeLocalGet(pBVar3,IVar7,(Type)0x2);
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      fetchOutParam(&local_e0,this,curr->ifFalse);
      IVar7 = TempVar::operator_cast_to_unsigned_int(&local_e0);
      ifFalse = Builder::makeLocalGet(pBVar3,IVar7,(Type)0x2);
      pSVar9 = Builder::makeSelect(pBVar2,(Expression *)pLVar8,(Expression *)ifTrue,
                                   (Expression *)ifFalse);
      args = Builder::makeLocalSet(pBVar1,IVar6,(Expression *)pSVar9);
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar6 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      pLVar8 = Builder::makeLocalGet(pBVar1,IVar6,(Type)0x2);
      e = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                    (this_00,(Expression *)any,(Expression *)append,args,pLVar8);
      TempVar::~TempVar(&local_e0);
      TempVar::~TempVar(&local_100);
      setOutParam(this,(Expression *)e,(TempVar *)local_c0);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)e);
      TempVar::~TempVar((TempVar *)&lowBits.ty);
      TempVar::~TempVar((TempVar *)&highBits.ty);
      TempVar::~TempVar((TempVar *)local_c0);
    }
    else if (bVar5) {
      __assert_fail("!hasOutParam(curr->ifFalse)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x619,"void wasm::I64ToI32Lowering::visitSelect(Select *)");
    }
  }
  return;
}

Assistant:

void visitSelect(Select* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!hasOutParam(curr->ifTrue)) {
      assert(!hasOutParam(curr->ifFalse));
      return;
    }
    assert(hasOutParam(curr->ifFalse));
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();
    TempVar cond = getTemp();
    Block* result = builder->blockify(
      builder->makeLocalSet(cond, curr->condition),
      builder->makeLocalSet(
        lowBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32), curr->ifTrue, curr->ifFalse)),
      builder->makeLocalSet(
        highBits,
        builder->makeSelect(
          builder->makeLocalGet(cond, Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifTrue), Type::i32),
          builder->makeLocalGet(fetchOutParam(curr->ifFalse), Type::i32))),
      builder->makeLocalGet(lowBits, Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }